

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_Dsd6DecomposeSingleVar(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  
  aVar4 = Abc_Clock();
  iVar2 = nVars;
  if (nVars < 2) {
    __assert_fail("nVars > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                  ,0x4aa,"int Dau_Dsd6DecomposeSingleVar(Dau_Dsd_t *, word *, int *, int)");
  }
LAB_0042f5a3:
  do {
    iVar1 = iVar2;
    if ((0 < iVar1) && (1 < nVars)) {
      iVar3 = Dau_Dsd6DecomposeSingleVarOne(p,pTruth,pVars,nVars,iVar1 + -1);
      iVar2 = iVar1 + -1;
      if (iVar3 == 0) goto LAB_0042f5a3;
      nVars = nVars + -1;
    }
    if ((iVar1 == 0) || (iVar2 = nVars, nVars == 1)) {
      if (nVars == 1) {
        Dau_DsdWriteVar(p,*pVars,(uint)*pTruth & 1);
        nVars = 0;
      }
      aVar5 = Abc_Clock();
      s_Times_0 = s_Times_0 + (aVar5 - aVar4);
      return nVars;
    }
  } while( true );
}

Assistant:

int Dau_Dsd6DecomposeSingleVar( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    assert( nVars > 1 );
    while ( 1 )
    {
        int v;
        for ( v = nVars - 1; v >= 0 && nVars > 1; v-- )
            if ( Dau_Dsd6DecomposeSingleVarOne( p, pTruth, pVars, nVars, v ) )
            {
                nVars--;
                break;
            }
        if ( v == -1 || nVars == 1 )
            break;
    }
    if ( nVars == 1 )
        Dau_DsdWriteVar( p, pVars[--nVars], (int)(pTruth[0] & 1) );
    s_Times[0] += Abc_Clock() - clk;
    return nVars;
}